

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void trim_leading_zeroes(char *buf,size_t bufsize,size_t maxtrim)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long lStack_68;
  uint8_t diff_1;
  size_t i;
  size_t d;
  uint8_t mask_1;
  size_t logd;
  uint8_t *ubuf;
  size_t mask;
  size_t sStack_30;
  uint8_t diff;
  size_t pos;
  size_t trim;
  size_t maxtrim_local;
  size_t bufsize_local;
  char *buf_local;
  
  sStack_30 = maxtrim;
  pos = maxtrim;
  if (maxtrim != 0) {
    while (uVar4 = sStack_30 - 1, sStack_30 != 0) {
      pos = (pos ^ uVar4) &
            ((long)((ulong)(byte)(buf[uVar4] ^ 0x30) - 1) >> 0x3f ^ 0xffffffffffffffffU) ^ pos;
      sStack_30 = uVar4;
    }
  }
  for (bVar2 = 0; bufsize >> (bVar2 & 0x3f) != 0; bVar2 = bVar2 + 1) {
    lVar3 = 1L << (bVar2 & 0x3f);
    for (lStack_68 = 0; (ulong)(lStack_68 + lVar3) < bufsize; lStack_68 = lStack_68 + 1) {
      bVar1 = -((byte)(pos >> (bVar2 & 0x3f)) & 1) & (buf[lStack_68] ^ buf[lStack_68 + lVar3]);
      buf[lStack_68] = buf[lStack_68] ^ bVar1;
      buf[lStack_68 + lVar3] = buf[lStack_68 + lVar3] ^ bVar1;
    }
  }
  return;
}

Assistant:

static void trim_leading_zeroes(char *buf, size_t bufsize, size_t maxtrim)
{
    size_t trim = maxtrim;

    /*
     * Look for the first character not equal to '0', to find the
     * shift count.
     */
    if (trim > 0) {
        for (size_t pos = trim; pos-- > 0 ;) {
            uint8_t diff = buf[pos] ^ '0';
            size_t mask = -((((size_t)diff) - 1) >> (SIZE_T_BITS - 1));
            trim ^= (trim ^ pos) & ~mask;
        }
    }

    /*
     * Now do the shift, in log n passes each of which does a
     * conditional shift by 2^i bytes if bit i is set in the shift
     * count.
     */
    uint8_t *ubuf = (uint8_t *)buf;
    for (size_t logd = 0; bufsize >> logd; logd++) {
        uint8_t mask = -(uint8_t)((trim >> logd) & 1);
        size_t d = (size_t)1 << logd;
        for (size_t i = 0; i+d < bufsize; i++) {
            uint8_t diff = mask & (ubuf[i] ^ ubuf[i+d]);
            ubuf[i] ^= diff;
            ubuf[i+d] ^= diff;
        }
    }
}